

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-writer-test.cc
# Opt level: O0

void __thiscall
ExprWriterTest_CountExprPrecedence_Test::TestBody(ExprWriterTest_CountExprPrecedence_Test *this)

{
  LogicalConstant other;
  LogicalConstant other_00;
  LogicalExpr rhs;
  BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)50,_(mp::expr::Kind)52>
  other_01;
  BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)50,_(mp::expr::Kind)52>
  other_02;
  BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)47,_(mp::expr::Kind)47>
  other_03;
  bool bVar1;
  ExprBase this_00;
  BasicExprFactory<std::allocator<char>_> *this_01;
  char *in_RDI;
  AssertionResult gtest_ar;
  LogicalExpr args [2];
  BinaryLogicalExpr e;
  BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69> (*in_stack_fffffffffffffed8) [2];
  undefined4 in_stack_fffffffffffffee0;
  Kind in_stack_fffffffffffffee4;
  undefined4 uVar2;
  uint in_stack_fffffffffffffef0;
  undefined4 uVar3;
  ExprBase in_stack_fffffffffffffef8;
  char *expected_expression;
  int line;
  Type type;
  CStringRef in_stack_ffffffffffffff18;
  ArrayRef<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>_> *in_stack_ffffffffffffff30;
  ExprWriterTest *in_stack_ffffffffffffff38;
  Message *in_stack_ffffffffffffff58;
  ExprBase this_02;
  BasicCStringRef<char> local_90;
  string local_88 [32];
  AssertionResult local_68;
  Impl *local_58;
  BasicExpr<(mp::expr::Kind)50,_(mp::expr::Kind)52> local_50;
  char local_48 [24];
  undefined8 local_30;
  undefined8 local_20;
  Impl *local_10;
  
  this_01 = (BasicExprFactory<std::allocator<char>_> *)(in_RDI + 0x10);
  local_20 = *(undefined8 *)(in_RDI + 0x48);
  uVar3 = 0;
  other.super_BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)48>.super_ExprBase.impl_._4_4_ = 0;
  other.super_BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)48>.super_ExprBase.impl_._0_4_ =
       in_stack_fffffffffffffef0;
  mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>::BasicExpr<mp::LogicalConstant>
            ((BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69> *)this_01,other,
             in_stack_fffffffffffffee4);
  local_30 = *(undefined8 *)(in_RDI + 0x50);
  other_00.super_BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)48>.super_ExprBase.impl_._4_4_ =
       uVar3;
  other_00.super_BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)48>.super_ExprBase.impl_._0_4_ =
       in_stack_fffffffffffffef0;
  mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>::BasicExpr<mp::LogicalConstant>
            ((BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69> *)this_01,other_00,
             in_stack_fffffffffffffee4);
  rhs.super_ExprBase.impl_._4_4_ = uVar3;
  rhs.super_ExprBase.impl_._0_4_ = in_stack_fffffffffffffef0;
  local_50.super_ExprBase.impl_ =
       (ExprBase)
       mp::BasicExprFactory<std::allocator<char>_>::MakeBinaryLogical
                 (this_01,in_stack_fffffffffffffee4,(LogicalExpr)in_stack_fffffffffffffef8.impl_,rhs
                 );
  expected_expression = local_48;
  other_01.super_BasicExpr<(mp::expr::Kind)50,_(mp::expr::Kind)52>.super_ExprBase.impl_._4_4_ =
       uVar3;
  other_01.super_BasicExpr<(mp::expr::Kind)50,_(mp::expr::Kind)52>.super_ExprBase.impl_._0_4_ =
       in_stack_fffffffffffffef0;
  local_10 = (Impl *)local_50.super_ExprBase.impl_;
  mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>::
  BasicExpr<mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>,(mp::expr::Kind)50,(mp::expr::Kind)52>>
            ((BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69> *)this_01,other_01,
             in_stack_fffffffffffffee4);
  local_58 = local_10;
  other_02.super_BasicExpr<(mp::expr::Kind)50,_(mp::expr::Kind)52>.super_ExprBase.impl_._4_4_ =
       uVar3;
  other_02.super_BasicExpr<(mp::expr::Kind)50,_(mp::expr::Kind)52>.super_ExprBase.impl_._0_4_ =
       in_stack_fffffffffffffef0;
  mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>::
  BasicExpr<mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>,(mp::expr::Kind)50,(mp::expr::Kind)52>>
            ((BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69> *)this_01,other_02,
             in_stack_fffffffffffffee4);
  fmt::BasicCStringRef<char>::BasicCStringRef(&local_90,"{}");
  type = (Type)((ulong)&stack0xffffffffffffff38 >> 0x20);
  mp::ArrayRef<mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>>::ArrayRef<2ul>
            ((ArrayRef<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>_> *)
             CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),in_stack_fffffffffffffed8
            );
  this_00.impl_ =
       (Impl *)ExprWriterTest::MakeCount(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
  other_03.super_BasicExpr<(mp::expr::Kind)47,_(mp::expr::Kind)47>.super_ExprBase.impl_._4_4_ =
       uVar3;
  other_03.super_BasicExpr<(mp::expr::Kind)47,_(mp::expr::Kind)47>.super_ExprBase.impl_._0_4_ =
       in_stack_fffffffffffffef0;
  this_02.impl_ = this_00.impl_;
  mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>::
  BasicExpr<mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>,(mp::expr::Kind)47,(mp::expr::Kind)47>>
            ((BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)this_01,other_03,
             in_stack_fffffffffffffee4);
  fmt::format<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>>
            (in_stack_ffffffffffffff18,
             (BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)this_00.impl_);
  testing::internal::EqHelper<false>::Compare<char[22],std::__cxx11::string>
            (expected_expression,(char *)CONCAT44(uVar3,in_stack_fffffffffffffef0),
             (char (*) [22])this_01,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
  line = (int)((ulong)expected_expression >> 0x20);
  std::__cxx11::string::~string(local_88);
  mp::ArrayRef<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>_>::~ArrayRef
            ((ArrayRef<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>_> *)0x12810d);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_68);
  uVar2 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffee4);
  if (!bVar1) {
    testing::Message::Message((Message *)this_00.impl_);
    testing::AssertionResult::failure_message((AssertionResult *)0x128195);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)this_00.impl_,type,in_RDI,line,
               (char *)CONCAT44(uVar3,in_stack_fffffffffffffef0));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)this_02.impl_,in_stack_ffffffffffffff58);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(uVar2,in_stack_fffffffffffffee0));
    testing::Message::~Message((Message *)0x1281e1);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x128224);
  return;
}

Assistant:

TEST_F(ExprWriterTest, CountExprPrecedence) {
  auto e = MakeBinaryLogical(ex::OR, l0, l1);
  LogicalExpr args[] = {e, e};
  CHECK_WRITE("count(0 || 1, 0 || 1)", MakeCount(args));
}